

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_void>::InnerLeaf<3>::move_backward(InnerLeaf<3> *this,int *first,int *last)

{
  HighsHashTableEntry<int,_void> *__n;
  array<unsigned_long,_39UL> *this_00;
  reference __dest;
  reference __src;
  int *in_RDX;
  int *in_RSI;
  HighsHashTableEntry<int,_void> *in_RDI;
  difference_type in_stack_ffffffffffffffc8;
  HighsHashTableEntry<int,_void> *in_stack_ffffffffffffffd0;
  HighsHashTableEntry<int,_void> *in_stack_ffffffffffffffe0;
  
  std::array<HighsHashTableEntry<int,_void>,_38UL>::begin
            ((array<HighsHashTableEntry<int,_void>,_38UL> *)0x569f69);
  __n = std::next<HighsHashTableEntry<int,void>*>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::array<HighsHashTableEntry<int,_void>,_38UL>::begin
            ((array<HighsHashTableEntry<int,_void>,_38UL> *)0x569f8e);
  this_00 = (array<unsigned_long,_39UL> *)
            std::next<HighsHashTableEntry<int,void>*>
                      (in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_void>,_38UL>::begin
            ((array<HighsHashTableEntry<int,_void>,_38UL> *)0x569fb4);
  std::next<HighsHashTableEntry<int,void>*>
            ((HighsHashTableEntry<int,_void> *)this_00,(difference_type)__n);
  std::move_backward<HighsHashTableEntry<int,void>*,HighsHashTableEntry<int,void>*>
            (in_stack_ffffffffffffffe0,in_RDI,(HighsHashTableEntry<int,_void> *)this_00);
  __dest = std::array<unsigned_long,_39UL>::operator[](this_00,(size_type)__n);
  __src = std::array<unsigned_long,_39UL>::operator[](this_00,(size_type)__n);
  memmove(__dest,__src,(long)(*in_RDX - *in_RSI) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }